

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O2

void __thiscall
re2::TestInstance::RunSearch
          (TestInstance *this,Engine type,StringPiece *orig_text,StringPiece *orig_context,
          Anchor anchor,Result *result)

{
  StringPiece *pSVar1;
  int iVar2;
  bool bVar3;
  Arg **args;
  Arg *pAVar4;
  ostream *poVar5;
  Arg *pAVar6;
  StringPiece *pSVar7;
  StringPiece *src;
  StringPiece *src_00;
  ulong uVar8;
  Anchor anchor_00;
  long lVar9;
  ulong uVar10;
  Anchor re_anchor;
  uint n;
  StringPiece s;
  StringPiece s_00;
  StringPiece s_01;
  StringPiece text;
  StringPiece context;
  string local_1f0;
  string local_1d0;
  int consumed;
  ostream local_1a8 [376];
  int iVar11;
  
  memset(result,0,0x118);
  if (this->regexp_ == (Regexp *)0x0) {
    result->skipped = true;
    return;
  }
  iVar2 = this->num_captures_;
  iVar11 = 0x10;
  if (iVar2 < 0x10) {
    iVar11 = iVar2;
  }
  n = iVar11 + 1;
  text.ptr_ = orig_text->ptr_;
  text.length_ = orig_text->length_;
  text._12_4_ = *(undefined4 *)&orig_text->field_0xc;
  context.ptr_ = orig_context->ptr_;
  context.length_ = orig_context->length_;
  context._12_4_ = *(undefined4 *)&orig_context->field_0xc;
  switch(type) {
  case kEngineBacktrack:
    goto switchD_00123db9_caseD_0;
  case kEngineNFA:
    if (this->prog_ == (Prog *)0x0) break;
    bVar3 = Prog::SearchNFA(this->prog_,&text,&context,anchor,this->kind_,result->submatch,n);
    goto LAB_001241ef;
  case kEngineDFA:
    if (this->prog_ != (Prog *)0x0) {
      bVar3 = Prog::SearchDFA(this->prog_,&text,&context,anchor,this->kind_,(StringPiece *)0x0,
                              &result->skipped,(vector<int,_std::allocator<int>_> *)0x0);
      result->matched = bVar3;
      goto LAB_00124200;
    }
    break;
  case kEngineDFA1:
    if ((this->prog_ != (Prog *)0x0) && (this->rprog_ != (Prog *)0x0)) {
      pSVar1 = result->submatch;
      bVar3 = Prog::SearchDFA(this->prog_,&text,&context,anchor,this->kind_,pSVar1,&result->skipped,
                              (vector<int,_std::allocator<int>_> *)0x0);
      result->matched = bVar3;
      if ((bVar3) &&
         (bVar3 = Prog::SearchDFA(this->rprog_,pSVar1,&context,kAnchored,kLongestMatch,pSVar1,
                                  &result->skipped,(vector<int,_std::allocator<int>_> *)0x0), !bVar3
         )) {
        LogMessage::LogMessage
                  ((LogMessage *)&consumed,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                   ,0x15c,2);
        poVar5 = std::operator<<(local_1a8,"Reverse DFA inconsistency: ");
        CEscape_abi_cxx11_(&local_1d0,(re2 *)this->regexp_str_,src);
        poVar5 = std::operator<<(poVar5,(string *)&local_1d0);
        poVar5 = std::operator<<(poVar5," on ");
        CEscape_abi_cxx11_(&local_1f0,(re2 *)&text,src_00);
        std::operator<<(poVar5,(string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1d0);
        LogMessage::~LogMessage((LogMessage *)&consumed);
        result->matched = false;
      }
      result->have_submatch0 = true;
      goto LAB_00124200;
    }
    break;
  case kEngineOnePass:
    if ((anchor != kUnanchored && this->prog_ != (Prog *)0x0) &&
       (bVar3 = Prog::IsOnePass(this->prog_), bVar3 && iVar2 < 5)) {
      bVar3 = Prog::SearchOnePass(this->prog_,&text,&context,anchor,this->kind_,result->submatch,n);
      goto LAB_001241ef;
    }
    break;
  case kEngineBitState:
    if (this->prog_ != (Prog *)0x0) {
      bVar3 = Prog::SearchBitState(this->prog_,&text,&context,anchor,this->kind_,result->submatch,n)
      ;
      goto LAB_001241ef;
    }
    break;
  case kEngineRE2:
  case kEngineRE2a:
  case kEngineRE2b:
    if ((this->re2_ != (RE2 *)0x0) && (text.ptr_ + text.length_ == context.ptr_ + context.length_))
    {
      re_anchor = (Anchor)(anchor == kAnchored);
      if (this->kind_ == kFullMatch) {
        re_anchor = ANCHOR_BOTH;
      }
      bVar3 = RE2::Match(this->re2_,&context,(int)text.ptr_ - (int)context.ptr_,
                         (int)(text.ptr_ + text.length_) - (int)context.ptr_,re_anchor,
                         result->submatch,n);
      result->matched = bVar3;
      result->have_submatch = -1 < iVar2;
      goto LAB_00124200;
    }
    break;
  case kEnginePCRE:
    if ((((this->re_ != (PCRE *)0x0) && (text.ptr_ == context.ptr_)) &&
        (text.ptr_ + text.length_ == context.ptr_ + context.length_)) &&
       (((s._8_8_ = 2, s.ptr_ = "\\s", bVar3 = StringPiece::contains(this->regexp_str_,s), !bVar3 &&
         (s_00._8_8_ = 2, s_00.ptr_ = "\\S", bVar3 = StringPiece::contains(this->regexp_str_,s_00),
         !bVar3)) ||
        (s_01._8_8_ = 1, s_01.ptr_ = "\v", bVar3 = StringPiece::contains(&text,s_01), !bVar3)))) {
      lVar9 = (long)(int)n;
      uVar8 = 0xffffffffffffffff;
      uVar10 = uVar8;
      if (-2 < iVar2) {
        uVar8 = lVar9 * 0x10;
        uVar10 = lVar9 * 8;
      }
      args = (Arg **)operator_new__(uVar10);
      pAVar4 = (Arg *)operator_new__(uVar8);
      if (n != 0) {
        pAVar6 = pAVar4;
        do {
          pAVar6->arg_ = (void *)0x0;
          pAVar6->parser_ = PCRE::Arg::parse_null;
          pAVar6 = pAVar6 + 1;
        } while (pAVar6 != pAVar4 + lVar9);
      }
      uVar10 = 0;
      uVar8 = 0;
      if (0 < (int)n) {
        uVar8 = (ulong)n;
      }
      pSVar1 = result->submatch;
      pSVar7 = pSVar1;
      pAVar6 = pAVar4;
      for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        pAVar6->arg_ = pSVar7;
        pAVar6->parser_ = PCRE::Arg::parse_stringpiece;
        args[uVar10] = pAVar6;
        pAVar6 = pAVar6 + 1;
        pSVar7 = pSVar7 + 1;
      }
      anchor_00 = (Anchor)(anchor == kAnchored);
      if (this->kind_ == kFullMatch) {
        anchor_00 = ANCHOR_BOTH;
      }
      PCRE::ClearHitLimit(this->re_);
      bVar3 = PCRE::DoMatch(this->re_,&text,anchor_00,&consumed,args,n);
      result->matched = bVar3;
      bVar3 = PCRE::HitLimit(this->re_);
      if (bVar3) {
        result->untrusted = true;
      }
      else {
        result->have_submatch = true;
        for (lVar9 = 0; uVar8 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
          if (*(char **)((long)&pSVar1->ptr_ + lVar9) == text.ptr_ + -1) {
            *(undefined8 *)((long)&pSVar1->ptr_ + lVar9) = 0;
            *(undefined4 *)((long)&result->submatch[0].length_ + lVar9) = 0;
          }
        }
      }
      operator_delete__(args);
      operator_delete__(pAVar4);
      goto LAB_00124200;
    }
    break;
  default:
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&consumed,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,300);
    poVar5 = std::operator<<(local_1a8,"Bad RunSearch type: ");
    std::ostream::operator<<(poVar5,type);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&consumed);
switchD_00123db9_caseD_0:
    if (this->prog_ != (Prog *)0x0) {
      bVar3 = Prog::UnsafeSearchBacktrack
                        (this->prog_,&text,&context,anchor,this->kind_,result->submatch,n);
LAB_001241ef:
      result->matched = bVar3;
      result->have_submatch = true;
      goto LAB_00124200;
    }
  }
  result->skipped = true;
LAB_00124200:
  if (result->matched == false) {
    memset(result->submatch,0,0x110);
  }
  return;
}

Assistant:

void TestInstance::RunSearch(Engine type,
                             const StringPiece& orig_text,
                             const StringPiece& orig_context,
                             Prog::Anchor anchor,
                             Result *result) {
  memset(result, 0, sizeof *result);
  if (regexp_ == NULL) {
    result->skipped = true;
    return;
  }
  int nsubmatch = 1 + num_captures_;  // NumCaptures doesn't count $0
  if (nsubmatch > kMaxSubmatch)
    nsubmatch = kMaxSubmatch;

  StringPiece text = orig_text;
  StringPiece context = orig_context;

  switch (type) {
    default:
      LOG(FATAL) << "Bad RunSearch type: " << (int)type;

    case kEngineBacktrack:
      if (prog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched =
        prog_->UnsafeSearchBacktrack(text, context, anchor, kind_,
                                     result->submatch, nsubmatch);
      result->have_submatch = true;
      break;

    case kEngineNFA:
      if (prog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched =
        prog_->SearchNFA(text, context, anchor, kind_,
                        result->submatch, nsubmatch);
      result->have_submatch = true;
      break;

    case kEngineDFA:
      if (prog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched = prog_->SearchDFA(text, context, anchor, kind_, NULL,
                                         &result->skipped, NULL);
      break;

    case kEngineDFA1:
      if (prog_ == NULL || rprog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched =
        prog_->SearchDFA(text, context, anchor, kind_, result->submatch,
                         &result->skipped, NULL);
      // If anchored, no need for second run,
      // but do it anyway to find more bugs.
      if (result->matched) {
        if (!rprog_->SearchDFA(result->submatch[0], context,
                               Prog::kAnchored, Prog::kLongestMatch,
                               result->submatch,
                               &result->skipped, NULL)) {
          LOG(ERROR) << "Reverse DFA inconsistency: "
                     << CEscape(regexp_str_)
                     << " on " << CEscape(text);
          result->matched = false;
        }
      }
      result->have_submatch0 = true;
      break;

    case kEngineOnePass:
      if (prog_ == NULL ||
          anchor == Prog::kUnanchored ||
          !prog_->IsOnePass() ||
          nsubmatch > Prog::kMaxOnePassCapture) {
        result->skipped = true;
        break;
      }
      result->matched = prog_->SearchOnePass(text, context, anchor, kind_,
                                      result->submatch, nsubmatch);
      result->have_submatch = true;
      break;

    case kEngineBitState:
      if (prog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched = prog_->SearchBitState(text, context, anchor, kind_,
                                              result->submatch, nsubmatch);
      result->have_submatch = true;
      break;

    case kEngineRE2:
    case kEngineRE2a:
    case kEngineRE2b: {
      if (!re2_ || text.end() != context.end()) {
        result->skipped = true;
        break;
      }

      RE2::Anchor re_anchor;
      if (anchor == Prog::kAnchored)
        re_anchor = RE2::ANCHOR_START;
      else
        re_anchor = RE2::UNANCHORED;
      if (kind_ == Prog::kFullMatch)
        re_anchor = RE2::ANCHOR_BOTH;

      result->matched = re2_->Match(
          context,
          static_cast<int>(text.begin() - context.begin()),
          static_cast<int>(text.end() - context.begin()),
          re_anchor,
          result->submatch,
          nsubmatch);
      result->have_submatch = nsubmatch > 0;
      break;
    }

    case kEnginePCRE: {
      if (!re_ || text.begin() != context.begin() ||
          text.end() != context.end()) {
        result->skipped = true;
        break;
      }

      // PCRE 8.34 or so started allowing vertical tab to match \s,
      // following a change made in Perl 5.18. RE2 does not.
      if ((regexp_str_.contains("\\s") || regexp_str_.contains("\\S")) &&
          text.contains("\v")) {
        result->skipped = true;
        break;
      }

      const PCRE::Arg **argptr = new const PCRE::Arg*[nsubmatch];
      PCRE::Arg *a = new PCRE::Arg[nsubmatch];
      for (int i = 0; i < nsubmatch; i++) {
        a[i] = PCRE::Arg(&result->submatch[i]);
        argptr[i] = &a[i];
      }
      int consumed;
      PCRE::Anchor pcre_anchor;
      if (anchor == Prog::kAnchored)
        pcre_anchor = PCRE::ANCHOR_START;
      else
        pcre_anchor = PCRE::UNANCHORED;
      if (kind_ == Prog::kFullMatch)
        pcre_anchor = PCRE::ANCHOR_BOTH;
      re_->ClearHitLimit();
      result->matched =
        re_->DoMatch(text,
                     pcre_anchor,
                     &consumed,
                     argptr, nsubmatch);
      if (re_->HitLimit()) {
        result->untrusted = true;
        delete[] argptr;
        delete[] a;
        break;
      }
      result->have_submatch = true;

      // Work around RE interface bug: PCRE returns -1 as the
      // offsets for an unmatched subexpression, and RE should
      // turn that into StringPiece(NULL) but in fact it uses
      // StringPiece(text.begin() - 1, 0).  Oops.
      for (int i = 0; i < nsubmatch; i++)
        if (result->submatch[i].begin() == text.begin() - 1)
          result->submatch[i] = NULL;
      delete[] argptr;
      delete[] a;
      break;
    }
  }

  if (!result->matched)
    memset(result->submatch, 0, sizeof result->submatch);
}